

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void lyp_del_includedup(lys_module *mod,int free_subs)

{
  ly_ctx *plVar1;
  byte local_21;
  uint8_t i;
  ly_modules_list *models;
  int free_subs_local;
  lys_module *mod_local;
  
  plVar1 = mod->ctx;
  if ((mod != (lys_module *)0x0) && ((*(ushort *)&mod->field_0x40 & 1) == 0)) {
    if ((plVar1->models).parsed_submodules_count != '\0') {
      local_21 = (plVar1->models).parsed_submodules_count;
      do {
        local_21 = local_21 - 1;
      } while ((*(ushort *)&(plVar1->models).parsed_submodules[local_21]->field_0x40 & 1) != 0);
      if ((plVar1->models).parsed_submodules[local_21] == mod) {
        if (free_subs != 0) {
          local_21 = (plVar1->models).parsed_submodules_count;
          while (local_21 = local_21 - 1,
                (*(ushort *)&(plVar1->models).parsed_submodules[local_21]->field_0x40 & 1) != 0) {
            lys_sub_module_remove_devs_augs((plVar1->models).parsed_submodules[local_21]);
            lys_submodule_module_data_free
                      ((lys_submodule *)(plVar1->models).parsed_submodules[local_21]);
            lys_submodule_free((lys_submodule *)(plVar1->models).parsed_submodules[local_21],
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
          }
        }
        (plVar1->models).parsed_submodules_count = local_21;
        if ((plVar1->models).parsed_submodules_count == '\0') {
          free((plVar1->models).parsed_submodules);
          (plVar1->models).parsed_submodules = (lys_module **)0x0;
        }
      }
    }
    return;
  }
  __assert_fail("mod && !mod->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                ,0xa35,"void lyp_del_includedup(struct lys_module *, int)");
}

Assistant:

void
lyp_del_includedup(struct lys_module *mod, int free_subs)
{
    struct ly_modules_list *models = &mod->ctx->models;
    uint8_t i;

    assert(mod && !mod->type);

    if (models->parsed_submodules_count) {
        for (i = models->parsed_submodules_count - 1; models->parsed_submodules[i]->type; --i);
        if (models->parsed_submodules[i] == mod) {
            if (free_subs) {
                for (i = models->parsed_submodules_count - 1; models->parsed_submodules[i]->type; --i) {
                    lys_sub_module_remove_devs_augs((struct lys_module *)models->parsed_submodules[i]);
                    lys_submodule_module_data_free((struct lys_submodule *)models->parsed_submodules[i]);
                    lys_submodule_free((struct lys_submodule *)models->parsed_submodules[i], NULL);
                }
            }

            models->parsed_submodules_count = i;
            if (!models->parsed_submodules_count) {
                free(models->parsed_submodules);
                models->parsed_submodules = NULL;
            }
        }
    }
}